

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

type_conflict2 jsteemann::atoi<unsigned_char>(char *p,char *e,bool *valid)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  
  if ((p == e) || (*p == '-')) {
    *valid = false;
    return '\0';
  }
  if (*p == '+') {
    uVar1 = atoi_positive<unsigned_char>(p + 1,e,valid);
    return uVar1;
  }
  if (p == e) {
    bVar4 = false;
    bVar3 = 0;
  }
  else {
    bVar3 = 0;
    do {
      if ((byte)(*p - 0x3aU) < 0xf6) {
LAB_00128f2b:
        bVar4 = false;
        goto LAB_00128f27;
      }
      bVar2 = *p - 0x30;
      if ((0x19 < bVar3) || (bVar3 == 0x19 && 5 < bVar2)) goto LAB_00128f2b;
      bVar3 = bVar2 + bVar3 * '\n';
      p = p + 1;
    } while (p < e);
    bVar4 = true;
  }
LAB_00128f27:
  *valid = bVar4;
  return bVar3;
}

Assistant:

inline typename std::enable_if<std::is_unsigned<T>::value, T>::type atoi(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  if (*p == '-') {
    valid = false;
    return T();
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive<T>(p, e, valid);
}